

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

Table * luaH_new(lua_State *L,int narray,int nhash)

{
  GCObject *o;
  undefined4 in_EDX;
  int in_ESI;
  lua_State *in_RDI;
  Table *t;
  size_t in_stack_ffffffffffffffe8;
  
  o = (GCObject *)
      luaM_realloc_((lua_State *)CONCAT44(t._4_4_,t._0_4_),in_RDI,CONCAT44(in_ESI,in_EDX),
                    in_stack_ffffffffffffffe8);
  luaC_link(in_RDI,o,'\x05');
  (o->h).metatable = (Table *)0x0;
  (o->h).flags = 0xff;
  (o->h).array = (TValue *)0x0;
  (o->h).sizearray = 0;
  (o->h).lsizenode = '\0';
  (o->h).node = &dummynode_;
  setarrayvector((lua_State *)CONCAT44(t._4_4_,t._0_4_),(Table *)in_RDI,in_ESI);
  setnodevector(L,(Table *)CONCAT44(narray,nhash),t._4_4_);
  return (Table *)o;
}

Assistant:

static Table*luaH_new(lua_State*L,int narray,int nhash){
Table*t=luaM_new(L,Table);
luaC_link(L,obj2gco(t),5);
t->metatable=NULL;
t->flags=cast_byte(~0);
t->array=NULL;
t->sizearray=0;
t->lsizenode=0;
t->node=cast(Node*,(&dummynode_));
setarrayvector(L,t,narray);
setnodevector(L,t,nhash);
return t;
}